

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.hpp
# Opt level: O3

void __thiscall spirv_cross::CompilerCPP::CompilerCPP(CompilerCPP *this,ParsedIR *ir_)

{
  CompilerGLSL::CompilerGLSL(&this->super_CompilerGLSL,ir_);
  (this->super_CompilerGLSL).super_Compiler._vptr_Compiler =
       (_func_int **)&PTR__CompilerCPP_003a3940;
  (this->resource_registrations).
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .buffer_size = 0;
  (this->resource_registrations).
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &(this->resource_registrations).stack_storage;
  (this->resource_registrations).buffer_capacity = 8;
  (this->impl_type)._M_dataplus._M_p = (pointer)&(this->impl_type).field_2;
  (this->impl_type)._M_string_length = 0;
  (this->impl_type).field_2._M_local_buf[0] = '\0';
  (this->resource_type)._M_dataplus._M_p = (pointer)&(this->resource_type).field_2;
  (this->resource_type)._M_string_length = 0;
  (this->resource_type).field_2._M_local_buf[0] = '\0';
  this->shared_counter = 0;
  (this->interface_name)._M_dataplus._M_p = (pointer)&(this->interface_name).field_2;
  (this->interface_name)._M_string_length = 0;
  (this->interface_name).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit CompilerCPP(const ParsedIR &ir_)
	    : CompilerGLSL(ir_)
	{
	}